

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# core.c
# Opt level: O1

void KeyCallback(GLFWwindow *window,int key,int scancode,int action,int mods)

{
  char *pcVar1;
  MsfGifResult result;
  char path [512];
  MsfGifResult local_238;
  char local_218 [512];
  
  if ((action == 1) && (CORE.Input.Keyboard.exitKey == key)) {
    glfwSetWindowShouldClose(CORE.Window.handle,1);
    return;
  }
  if (key == 0x12d && action == 1) {
    if (mods == 2) {
      if (gifRecording != '\x01') {
        gifRecording = 1;
        gifFramesCounter = 0;
        msf_gif_begin(&gifState,CORE.Window.screen.width,CORE.Window.screen.height);
        screenshotCounter = screenshotCounter + 1;
        pcVar1 = TextFormat("screenrec%03i.gif");
        TraceLog(3,"SYSTEM: Start animated GIF recording: %s",pcVar1);
        return;
      }
      gifRecording = '\0';
      msf_gif_end(&local_238,&gifState);
      memset(local_218,0,0x200);
      pcVar1 = TextFormat("./screenrec%03i.gif",(ulong)(uint)screenshotCounter);
      strcpy(local_218,pcVar1);
      SaveFileData(local_218,local_238.data,(uint)local_238.dataSize);
      if (local_238.data != (void *)0x0) {
        free(local_238.data);
      }
      TraceLog(3,"SYSTEM: Finish animated GIF recording");
    }
    else {
      pcVar1 = TextFormat("screenshot%03i.png",(ulong)(uint)screenshotCounter);
      TakeScreenshot(pcVar1);
      screenshotCounter = screenshotCounter + 1;
    }
  }
  else {
    *(bool *)((long)key + 0x1c431c) = action != 0;
    if ((long)CORE.Input.Keyboard.keyPressedQueueCount < 0x10 && action == 1) {
      CORE.Input.Keyboard.keyPressedQueue[CORE.Input.Keyboard.keyPressedQueueCount] = key;
      CORE.Input.Keyboard.keyPressedQueueCount = CORE.Input.Keyboard.keyPressedQueueCount + 1;
    }
  }
  return;
}

Assistant:

static void KeyCallback(GLFWwindow *window, int key, int scancode, int action, int mods)
{
    //TRACELOG(LOG_DEBUG, "Key Callback: KEY:%i(%c) - SCANCODE:%i (STATE:%i)", key, key, scancode, action);

    if (key == CORE.Input.Keyboard.exitKey && action == GLFW_PRESS)
    {
        glfwSetWindowShouldClose(CORE.Window.handle, GLFW_TRUE);

        // NOTE: Before closing window, while loop must be left!
    }
#if defined(SUPPORT_SCREEN_CAPTURE)
    else if (key == GLFW_KEY_F12 && action == GLFW_PRESS)
    {
#if defined(SUPPORT_GIF_RECORDING)
        if (mods == GLFW_MOD_CONTROL)
        {
            if (gifRecording)
            {
                gifRecording = false;

                MsfGifResult result = msf_gif_end(&gifState);

                char path[512] = { 0 };
            #if defined(PLATFORM_ANDROID)
                strcpy(path, CORE.Android.internalDataPath);
                strcat(path, TextFormat("./screenrec%03i.gif", screenshotCounter));
            #else
                strcpy(path, TextFormat("./screenrec%03i.gif", screenshotCounter));
            #endif

                SaveFileData(path, result.data, (unsigned int)result.dataSize);
                msf_gif_free(result);

            #if defined(PLATFORM_WEB)
                // Download file from MEMFS (emscripten memory filesystem)
                // saveFileFromMEMFSToDisk() function is defined in raylib/templates/web_shel/shell.html
                emscripten_run_script(TextFormat("saveFileFromMEMFSToDisk('%s','%s')", TextFormat("screenrec%03i.gif", screenshotCounter - 1), TextFormat("screenrec%03i.gif", screenshotCounter - 1)));
            #endif

                TRACELOG(LOG_INFO, "SYSTEM: Finish animated GIF recording");
            }
            else
            {
                gifRecording = true;
                gifFramesCounter = 0;

                msf_gif_begin(&gifState, CORE.Window.screen.width, CORE.Window.screen.height);
                screenshotCounter++;

                TRACELOG(LOG_INFO, "SYSTEM: Start animated GIF recording: %s", TextFormat("screenrec%03i.gif", screenshotCounter));
            }
        }
        else
#endif  // SUPPORT_GIF_RECORDING
        {
            TakeScreenshot(TextFormat("screenshot%03i.png", screenshotCounter));
            screenshotCounter++;
        }
    }
#endif  // SUPPORT_SCREEN_CAPTURE
    else
    {
        // WARNING: GLFW could return GLFW_REPEAT, we need to consider it as 1
        // to work properly with our implementation (IsKeyDown/IsKeyUp checks)
        if (action == GLFW_RELEASE) CORE.Input.Keyboard.currentKeyState[key] = 0;
        else CORE.Input.Keyboard.currentKeyState[key] = 1;

        // Check if there is space available in the key queue
        if ((CORE.Input.Keyboard.keyPressedQueueCount < MAX_KEY_PRESSED_QUEUE) && (action == GLFW_PRESS))
        {
            // Add character to the queue
            CORE.Input.Keyboard.keyPressedQueue[CORE.Input.Keyboard.keyPressedQueueCount] = key;
            CORE.Input.Keyboard.keyPressedQueueCount++;
        }
    }
}